

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O2

void cs::
     foreach_helper<phmap::flat_hash_set<cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<cs_impl::any>>,cs_impl::any>
               (context_t *context,string *iterator,var *obj,
               deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *body)

{
  element_type *peVar1;
  ctrl_t *pcVar2;
  size_t sVar3;
  _Elt_pointer ppsVar4;
  anon_union_8_1_a8a14541_for_iterator_1 val;
  flat_hash_set<cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
  *pfVar5;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
  *this;
  _Elt_pointer ppsVar6;
  _Elt_pointer ppsVar7;
  scope_guard scope;
  const_iterator __begin0;
  scope_guard local_b8;
  _Map_pointer local_b0;
  string *local_a8;
  iterator local_a0 [7];
  
  local_a8 = iterator;
  pfVar5 = cs_impl::any::
           const_val<phmap::flat_hash_set<cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<cs_impl::any>>>
                     (obj);
  if ((pfVar5->
      super_raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
      ).size_ != 0) {
    peVar1 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1->break_block == true) {
      peVar1->break_block = false;
    }
    if (peVar1->continue_block == true) {
      peVar1->continue_block = false;
    }
    scope_guard::scope_guard(&local_b8,context);
    this = &cs_impl::any::
            const_val<phmap::flat_hash_set<cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<cs_impl::any>>>
                      (obj)->
            super_raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
    ;
    local_a0[0] = phmap::priv::
                  raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
                  ::begin(this);
    pcVar2 = this->ctrl_;
    sVar3 = this->capacity_;
    while (local_a0[0].ctrl_ != pcVar2 + sVar3) {
      val = local_a0[0].field_1;
      process_context::poll_event((process_context *)current_process);
      domain_manager::add_var_no_return<std::__cxx11::string_const&>
                (&(((((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr)->instance).
                    super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_runtime_type).storage,local_a8,val.slot_);
      ppsVar6 = (body->
                super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>).
                _M_impl.super__Deque_impl_data._M_start._M_cur;
      ppsVar7 = (body->
                super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>).
                _M_impl.super__Deque_impl_data._M_start._M_last;
      local_b0 = (body->
                 super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_start._M_node;
      ppsVar4 = (body->
                super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>).
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      while (ppsVar6 != ppsVar4) {
        statement_base::run(*ppsVar6);
        peVar1 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->instance).
                 super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar1->return_fcall != false) goto LAB_00165769;
        if (peVar1->break_block == true) {
          peVar1->break_block = false;
          goto LAB_00165769;
        }
        if (peVar1->continue_block != false) {
          peVar1->continue_block = false;
          break;
        }
        ppsVar6 = ppsVar6 + 1;
        if (ppsVar6 == ppsVar7) {
          ppsVar6 = local_b0[1];
          local_b0 = local_b0 + 1;
          ppsVar7 = ppsVar6 + 0x40;
        }
      }
      scope_guard::clear(&local_b8);
      phmap::priv::
      raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
      ::iterator::operator++(local_a0);
    }
LAB_00165769:
    scope_guard::~scope_guard(&local_b8);
  }
  return;
}

Assistant:

void foreach_helper(const context_t &context, const string &iterator, const var &obj,
	                    std::deque<statement_base *> &body)
	{
		if (obj.const_val<T>().empty())
			return;
		if (context->instance->break_block)
			context->instance->break_block = false;
		if (context->instance->continue_block)
			context->instance->continue_block = false;
		scope_guard scope(context);
		for (const X &it: obj.const_val<T>()) {
			current_process->poll_event();
			context->instance->storage.add_var_no_return(iterator, it);
			for (auto &ptr: body) {
				try {
					ptr->run();
				}
				catch (const cs::exception &e) {
					throw e;
				}
				catch (const std::exception &e) {
					throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
				}
				if (context->instance->return_fcall) {
					return;
				}
				if (context->instance->break_block) {
					context->instance->break_block = false;
					return;
				}
				if (context->instance->continue_block) {
					context->instance->continue_block = false;
					break;
				}
			}
			scope.clear();
		}
	}